

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmIntegerLiteral(LlvmCompilationContext *ctx,ExprIntegerLiteral *node)

{
  TypeBase *type;
  LLVMTypeRef pLVar1;
  LLVMValueRef pLVar2;
  ExprIntegerLiteral *node_local;
  LlvmCompilationContext *ctx_local;
  
  type = GetStackType(ctx,(node->super_ExprBase).type);
  pLVar1 = CompileLlvmType(ctx,type);
  pLVar2 = LLVMConstInt(pLVar1,node->value,true);
  pLVar2 = CheckType(ctx,&node->super_ExprBase,pLVar2);
  return pLVar2;
}

Assistant:

LLVMValueRef CompileLlvmIntegerLiteral(LlvmCompilationContext &ctx, ExprIntegerLiteral *node)
{
	return CheckType(ctx, node, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->type)), node->value, true));
}